

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_util_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::EncodingUtilTest_TestDecodeBugsSeenInPROD_Test::
EncodingUtilTest_TestDecodeBugsSeenInPROD_Test(EncodingUtilTest_TestDecodeBugsSeenInPROD_Test *this)

{
  EncodingUtilTest_TestDecodeBugsSeenInPROD_Test *this_local;
  
  EncodingUtilTest::EncodingUtilTest(&this->super_EncodingUtilTest);
  (this->super_EncodingUtilTest).super_Test._vptr_Test =
       (_func_int **)&PTR__EncodingUtilTest_TestDecodeBugsSeenInPROD_Test_003d9038;
  return;
}

Assistant:

TEST_F(EncodingUtilTest, TestDecodeBugsSeenInPROD)
{
    // GCS-100613
    int32_t scale = 8;
    EXPECT_NEAR(64.391, EncodingUtil::DecodeDecimal(6439100000L, scale), DELTA);
    EXPECT_NEAR(6.439, EncodingUtil::DecodeDecimal(643900000L, scale), DELTA);
    EXPECT_NEAR(64.1, EncodingUtil::DecodeDecimal(6410000000L, scale), DELTA);
    EXPECT_NEAR(64.99999999, EncodingUtil::DecodeDecimal(6499999999L, scale), DELTA);
    EXPECT_NEAR(64.00000001, EncodingUtil::DecodeDecimal(6400000001L, scale), DELTA);

    // GCS-100797
    EXPECT_NEAR(1.45622, EncodingUtil::DecodeDecimal(145622000L, scale), DELTA);
}